

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

void __thiscall
booster::locale::impl_posix::num_punct_posix<wchar_t>::~num_punct_posix
          (num_punct_posix<wchar_t> *this)

{
  pointer pcVar1;
  pointer pwVar2;
  
  *(undefined ***)this = &PTR__num_punct_posix_001d19b0;
  pcVar1 = (this->grouping_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->grouping_).field_2) {
    operator_delete(pcVar1);
  }
  pwVar2 = (this->thousands_sep_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar2 != &(this->thousands_sep_).field_2) {
    operator_delete(pwVar2);
  }
  pwVar2 = (this->decimal_point_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar2 != &(this->decimal_point_).field_2) {
    operator_delete(pwVar2);
  }
  std::__cxx11::numpunct<wchar_t>::~numpunct(&this->super_numpunct<wchar_t>);
  operator_delete(this);
  return;
}

Assistant:

num_punct_posix(locale_t lc,size_t refs = 0) : 
        std::numpunct<CharType>(refs)
    {
        basic_numpunct np(lc);
        to_str(np.thousands_sep,thousands_sep_,lc);
        to_str(np.decimal_point,decimal_point_,lc);
        grouping_ = np.grouping;
        if(thousands_sep_.size() > 1)
            grouping_ = std::string();
        if(decimal_point_.size() > 1)
            decimal_point_ = CharType('.');
    }